

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  runtime_error *e;
  ApplicationFactory local_39;
  Application local_38;
  char **local_18;
  char **param_1_local;
  int param_0_local;
  
  param_1_local._4_4_ = 0;
  local_18 = param_2;
  param_1_local._0_4_ = param_1;
  ApplicationFactory::make(&local_38,&local_39);
  solitaire::Application::run(&local_38);
  solitaire::Application::~Application(&local_38);
  return 0;
}

Assistant:

int main(int, char**) try {
    ApplicationFactory {}.make().run();
    return 0;
}
catch (const std::runtime_error& e) {
    std::cout << e.what() << std::endl;
    return -1;
}